

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zeKernelGetIndirectAccess
          (ze_kernel_handle_t hKernel,ze_kernel_indirect_access_flags_t *pFlags)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hKernel + 8) + 0x590) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hKernel + 8) + 0x590))(*(undefined8 *)hKernel);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetIndirectAccess(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_kernel_indirect_access_flags_t* pFlags       ///< [out] query result for kernel indirect access flags.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_kernel_object_t*>( hKernel )->dditable;
        auto pfnGetIndirectAccess = dditable->ze.Kernel.pfnGetIndirectAccess;
        if( nullptr == pfnGetIndirectAccess )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // forward to device-driver
        result = pfnGetIndirectAccess( hKernel, pFlags );

        return result;
    }